

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

long xmlByteConsumed(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlCharEncodingHandler *handler;
  uchar *in;
  xmlCharEncError xVar2;
  uchar *out;
  xmlParserInputBufferPtr pxVar3;
  long lVar4;
  ulong uVar5;
  uchar *cur;
  int local_28;
  int toconv;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  _local_28 = 0xffffffffffffffff;
  pxVar1 = ctxt->input;
  if (pxVar1 == (xmlParserInputPtr)0x0) {
    return -1;
  }
  pxVar3 = pxVar1->buf;
  if ((pxVar3 == (xmlParserInputBufferPtr)0x0) ||
     (handler = pxVar3->encoder, handler == (xmlCharEncodingHandler *)0x0)) {
    return (long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
  }
  in = pxVar1->cur;
  if ((long)pxVar1->end - (long)in < 1) {
    uVar5 = 0;
LAB_0012a364:
    lVar4 = -1;
    if (uVar5 <= pxVar3->rawconsumed) {
      lVar4 = pxVar3->rawconsumed - uVar5;
    }
  }
  else {
    out = (uchar *)(*xmlMalloc)(32000);
    if (out != (uchar *)0x0) {
      _local_28 = CONCAT44(*(int *)&pxVar1->end - (int)in,32000);
      xVar2 = xmlEncOutputChunk(handler,out,&local_28,in,&toconv);
      (*xmlFree)(out);
      if (xVar2 == XML_ENC_ERR_SUCCESS) {
        pxVar3 = pxVar1->buf;
        uVar5 = (ulong)local_28;
        goto LAB_0012a364;
      }
    }
    lVar4 = -1;
  }
  return lVar4;
}

Assistant:

long
xmlByteConsumed(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in;

    if (ctxt == NULL)
        return(-1);
    in = ctxt->input;
    if (in == NULL)
        return(-1);

    if ((in->buf != NULL) && (in->buf->encoder != NULL)) {
        int unused = 0;
	xmlCharEncodingHandler * handler = in->buf->encoder;

        /*
	 * Encoding conversion, compute the number of unused original
	 * bytes from the input not consumed and subtract that from
	 * the raw consumed value, this is not a cheap operation
	 */
        if (in->end - in->cur > 0) {
	    unsigned char *convbuf;
	    const unsigned char *cur = (const unsigned char *)in->cur;
	    int toconv, ret;

            convbuf = xmlMalloc(32000);
            if (convbuf == NULL)
                return(-1);

            toconv = in->end - cur;
            unused = 32000;
            ret = xmlEncOutputChunk(handler, convbuf, &unused, cur, &toconv);

            xmlFree(convbuf);

            if (ret != XML_ENC_ERR_SUCCESS)
                return(-1);
	}

	if (in->buf->rawconsumed < (unsigned long) unused)
	    return(-1);
	return(in->buf->rawconsumed - unused);
    }

    return(in->consumed + (in->cur - in->base));
}